

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateNoCompression
               (ucvector *out,LodePNGBitReader *reader,LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint error;
  uint NLEN;
  uint LEN;
  size_t size;
  size_t bytepos;
  LodePNGDecompressSettings *settings_local;
  LodePNGBitReader *reader_local;
  ucvector *out_local;
  
  uVar1 = reader->size;
  uVar4 = reader->bp + 7 >> 3;
  if (uVar4 + 4 < uVar1) {
    uVar2 = (uint)reader->data[uVar4] + (uint)reader->data[uVar4 + 1] * 0x100;
    lVar5 = uVar4 + 4;
    if ((settings->ignore_nlen == 0) &&
       (uVar2 + (uint)reader->data[uVar4 + 2] + (uint)reader->data[uVar4 + 3] * 0x100 != 0xffff)) {
      out_local._4_4_ = 0x15;
    }
    else {
      uVar3 = ucvector_resize(out,out->size + (ulong)uVar2);
      if (uVar3 == 0) {
        out_local._4_4_ = 0x53;
      }
      else if (uVar1 < lVar5 + (ulong)uVar2) {
        out_local._4_4_ = 0x17;
      }
      else {
        lodepng_memcpy(out->data + (out->size - (ulong)uVar2),reader->data + lVar5,(ulong)uVar2);
        reader->bp = ((ulong)uVar2 + lVar5) * 8;
        out_local._4_4_ = 0;
      }
    }
  }
  else {
    out_local._4_4_ = 0x34;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned inflateNoCompression(ucvector* out, LodePNGBitReader* reader,
                                     const LodePNGDecompressSettings* settings) {
  size_t bytepos;
  size_t size = reader->size;
  unsigned LEN, NLEN, error = 0;

  /*go to first boundary of byte*/
  bytepos = (reader->bp + 7u) >> 3u;

  /*read LEN (2 bytes) and NLEN (2 bytes)*/
  if(bytepos + 4 >= size) return 52; /*error, bit pointer will jump past memory*/
  LEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;
  NLEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;

  /*check if 16-bit NLEN is really the one's complement of LEN*/
  if(!settings->ignore_nlen && LEN + NLEN != 65535) {
    return 21; /*error: NLEN is not one's complement of LEN*/
  }

  if(!ucvector_resize(out, out->size + LEN)) return 83; /*alloc fail*/

  /*read the literal data: LEN bytes are now stored in the out buffer*/
  if(bytepos + LEN > size) return 23; /*error: reading outside of in buffer*/

  lodepng_memcpy(out->data + out->size - LEN, reader->data + bytepos, LEN);
  bytepos += LEN;

  reader->bp = bytepos << 3u;

  return error;
}